

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixVfs_Stat(char *zPath,jx9_value *pArray,jx9_value *pWorker)

{
  int iVar1;
  undefined1 auStack_b8 [4];
  int rc;
  stat st;
  jx9_value *pWorker_local;
  jx9_value *pArray_local;
  char *zPath_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)pWorker;
  iVar1 = stat(zPath,(stat *)auStack_b8);
  if (iVar1 == 0) {
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],_auStack_b8);
    jx9_array_add_strkey_elem(pArray,"dev",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],st.st_dev);
    jx9_array_add_strkey_elem(pArray,"ino",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],(int)st.st_nlink);
    jx9_array_add_strkey_elem(pArray,"mode",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],(int)st.st_ino);
    jx9_array_add_strkey_elem(pArray,"nlink",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],st.st_nlink._4_4_);
    jx9_array_add_strkey_elem(pArray,"uid",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],st.st_mode);
    jx9_array_add_strkey_elem(pArray,"gid",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],st.st_gid);
    jx9_array_add_strkey_elem(pArray,"rdev",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],st.st_rdev);
    jx9_array_add_strkey_elem(pArray,"size",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],st.st_blocks);
    jx9_array_add_strkey_elem(pArray,"atime",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],st.st_atim.tv_nsec);
    jx9_array_add_strkey_elem(pArray,"mtime",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int64((jx9_value *)st.__glibc_reserved[2],st.st_mtim.tv_nsec);
    jx9_array_add_strkey_elem(pArray,"ctime",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],(int)st.st_size);
    jx9_array_add_strkey_elem(pArray,"blksize",(jx9_value *)st.__glibc_reserved[2]);
    jx9_value_int((jx9_value *)st.__glibc_reserved[2],(int)st.st_blksize);
    jx9_array_add_strkey_elem(pArray,"blocks",(jx9_value *)st.__glibc_reserved[2]);
    zPath_local._4_4_ = 0;
  }
  else {
    zPath_local._4_4_ = -1;
  }
  return zPath_local._4_4_;
}

Assistant:

static int UnixVfs_Stat(const char *zPath, jx9_value *pArray, jx9_value *pWorker)
{
	struct stat st;
	int rc;
	rc = stat(zPath, &st);
	if( rc != 0 ){ 
	 return -1;
	}
	/* dev */
	jx9_value_int64(pWorker, (jx9_int64)st.st_dev);
	jx9_array_add_strkey_elem(pArray, "dev", pWorker); /* Will make it's own copy */
	/* ino */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ino);
	jx9_array_add_strkey_elem(pArray, "ino", pWorker); /* Will make it's own copy */
	/* mode */
	jx9_value_int(pWorker, (int)st.st_mode);
	jx9_array_add_strkey_elem(pArray, "mode", pWorker);
	/* nlink */
	jx9_value_int(pWorker, (int)st.st_nlink);
	jx9_array_add_strkey_elem(pArray, "nlink", pWorker); /* Will make it's own copy */
	/* uid, gid, rdev */
	jx9_value_int(pWorker, (int)st.st_uid);
	jx9_array_add_strkey_elem(pArray, "uid", pWorker);
	jx9_value_int(pWorker, (int)st.st_gid);
	jx9_array_add_strkey_elem(pArray, "gid", pWorker);
	jx9_value_int(pWorker, (int)st.st_rdev);
	jx9_array_add_strkey_elem(pArray, "rdev", pWorker);
	/* size */
	jx9_value_int64(pWorker, (jx9_int64)st.st_size);
	jx9_array_add_strkey_elem(pArray, "size", pWorker); /* Will make it's own copy */
	/* atime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_atime);
	jx9_array_add_strkey_elem(pArray, "atime", pWorker); /* Will make it's own copy */
	/* mtime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_mtime);
	jx9_array_add_strkey_elem(pArray, "mtime", pWorker); /* Will make it's own copy */
	/* ctime */
	jx9_value_int64(pWorker, (jx9_int64)st.st_ctime);
	jx9_array_add_strkey_elem(pArray, "ctime", pWorker); /* Will make it's own copy */
	/* blksize, blocks */
	jx9_value_int(pWorker, (int)st.st_blksize);		
	jx9_array_add_strkey_elem(pArray, "blksize", pWorker);
	jx9_value_int(pWorker, (int)st.st_blocks);
	jx9_array_add_strkey_elem(pArray, "blocks", pWorker);
	return JX9_OK;
}